

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTable::selectColumn(QAccessibleTable *this,int column)

{
  QAccessibleObject *pQVar1;
  char cVar2;
  SelectionBehavior SVar3;
  SelectionMode SVar4;
  int iVar5;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar6;
  QItemSelectionModel *pQVar7;
  QAbstractItemView *this_01;
  bool bVar8;
  long in_FS_OFFSET;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar6 = QAbstractItemView::model(this_00);
  pQVar7 = QAbstractItemView::selectionModel(this_00);
  if (pQVar7 == (QItemSelectionModel *)0x0 || pQVar6 == (QAbstractItemModel *)0x0)
  goto LAB_005320a8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = -0x55555556;
  iStack_74 = -0x55555556;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,0,column,(QModelIndex *)&local_58);
  bVar8 = false;
  if (((local_78 < 0) || (bVar8 = false, iStack_74 < 0)) || (local_68 == (undefined1 *)0x0))
  goto LAB_005320aa;
  (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
  this_01 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  SVar3 = QAbstractItemView::selectionBehavior(this_01);
  if (SVar3 != SelectRows) {
    SVar4 = QAbstractItemView::selectionMode(this_00);
    if (SVar4 != NoSelection) {
      if (SVar4 == ContiguousSelection) {
LAB_0053210c:
        if (column != 0) {
          cVar2 = QItemSelectionModel::isColumnSelected
                            ((int)pQVar7,(QModelIndex *)(ulong)(column - 1));
          if (cVar2 != '\0') goto LAB_00532141;
        }
        cVar2 = QItemSelectionModel::isColumnSelected
                          ((int)pQVar7,(QModelIndex *)(ulong)(column + 1));
        if (cVar2 == '\0') {
          QAbstractItemView::clearSelection(this_00);
        }
      }
      else if (SVar4 == SingleSelection) {
        SVar3 = QAbstractItemView::selectionBehavior(this_00);
        if (SVar3 != SelectColumns) {
          iVar5 = (**(code **)(*(long *)this + 0x60))();
          if (1 < iVar5) goto LAB_005320a8;
        }
        goto LAB_0053210c;
      }
LAB_00532141:
      (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,&local_78,0x42);
      bVar8 = true;
      goto LAB_005320aa;
    }
  }
LAB_005320a8:
  bVar8 = false;
LAB_005320aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::selectColumn(int column)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(0, column, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectRows)
        return false;

    switch (theView->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (theView->selectionBehavior() != QAbstractItemView::SelectColumns && rowCount() > 1)
            return false;
        Q_FALLTHROUGH();
    case QAbstractItemView::ContiguousSelection:
        if ((!column || !selectionModel->isColumnSelected(column - 1, rootIndex))
            && !selectionModel->isColumnSelected(column + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    selectionModel->select(index, QItemSelectionModel::Select | QItemSelectionModel::Columns);
    return true;
}